

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::erase
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int *key)

{
  bool bVar1;
  uint pos;
  int iVar2;
  int iVar3;
  
  pos = upper_bound<int>(this,key);
  iVar3 = 0;
  if (pos != 0) {
    iVar3 = 0;
    if (*key == this->key_slots_[(long)(int)pos + -1]) {
      iVar2 = 0x7fffffff;
      if (pos != this->data_capacity_) {
        iVar2 = this->key_slots_[(int)pos];
      }
      iVar3 = 0;
      while (0 < (int)pos) {
        pos = pos - 1;
        if (*key != this->key_slots_[pos]) break;
        this->key_slots_[pos] = iVar2;
        bVar1 = check_exists(this,pos);
        iVar3 = iVar3 + (uint)bVar1;
        unset_bit(this,pos);
      }
      iVar2 = this->num_keys_ - iVar3;
      this->num_keys_ = iVar2;
      if ((double)iVar2 < this->contraction_threshold_) {
        resize(this,0.8,false,false,false);
        this->num_resizes_ = this->num_resizes_ + 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int erase(const T& key) {
    int pos = upper_bound(key);

    if (pos == 0 || !key_equal(ALEX_DATA_NODE_KEY_AT(pos - 1), key)) return 0;

    // Erase preceding positions until we reach a key with smaller value
    int num_erased = 0;
    T next_key;
    if (pos == data_capacity_) {
      next_key = kEndSentinel_;
    } else {
      next_key = ALEX_DATA_NODE_KEY_AT(pos);
    }
    pos--;
    while (pos >= 0 && key_equal(ALEX_DATA_NODE_KEY_AT(pos), key)) {
      ALEX_DATA_NODE_KEY_AT(pos) = next_key;
      num_erased += check_exists(pos);
      unset_bit(pos);
      pos--;
    }

    num_keys_ -= num_erased;

    if (num_keys_ < contraction_threshold_) {
      resize(kMaxDensity_);  // contract
      num_resizes_++;
    }
    return num_erased;
  }